

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_93(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  QPDFObjectHandle QVar3;
  allocator<char> local_c9;
  QPDFObjectHandle oh1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QPDFObjectHandle oh4;
  QPDFObjectHandle oh2;
  QPDFObjectHandle local_78;
  QPDFObjectHandle trailer;
  QPDFObjectHandle root2;
  QPDFObjectHandle oh3;
  QPDFObjectHandle root1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"/Root",(allocator<char> *)&root2);
  QPDFObjectHandle::getKey((string *)&root1);
  std::__cxx11::string::~string((string *)&local_b8);
  QPDF::getRoot();
  cVar1 = QPDFObjectHandle::isSameObjectAs(&root1);
  if (cVar1 == '\0') {
    __assert_fail("root1.isSameObjectAs(root2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcc8,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf((char *)&oh1,0x140f7d);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&oh2,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&oh1);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&oh1);
  if (cVar1 == '\0') {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccb,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf((char *)&oh3,0x140f7d);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&oh1);
  if (cVar1 != '\0') {
    __assert_fail("!oh1.isSameObjectAs(oh3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccd,"void test_93(QPDF &, const char *)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"/One",(allocator<char> *)&local_78);
  operator____qpdf((char *)&oh4,0x140862);
  QPDFObjectHandle::replaceKey((string *)&oh2,(QPDFObjectHandle *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&oh4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_b8);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&oh1);
  if (cVar1 == '\0') {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccf,"void test_93(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar2 = std::operator==(&local_b8,"<< /One /Three >>");
  if (!bVar2) {
    __assert_fail("oh2.unparse() == \"<< /One /Three >>\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd0,"void test_93(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_b8);
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    __assert_fail("!oh1.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd1,"void test_93(QPDF &, const char *)");
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&oh1);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&oh4;
  QPDF::makeIndirectObject(QVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&oh1);
  if (cVar1 == '\0') {
    __assert_fail("oh1.isSameObjectAs(oh4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd3,"void test_93(QPDF &, const char *)");
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 != '\0') {
    cVar1 = QPDFObjectHandle::isIndirect();
    if (cVar1 == '\0') {
      __assert_fail("oh4.isIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xcd5,"void test_93(QPDF &, const char *)");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"/Potato",(allocator<char> *)&local_78);
    QPDFObjectHandle::replaceKey((string *)&trailer,(QPDFObjectHandle *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Potato",&local_c9);
    QPDFObjectHandle::getKey((string *)&local_78);
    cVar1 = QPDFObjectHandle::isSameObjectAs(&local_78);
    if (cVar1 != '\0') {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh4.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh3.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh1.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&root2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&root1.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assert_fail("trailer.getKey(\"/Potato\").isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd7,"void test_93(QPDF &, const char *)");
  }
  __assert_fail("oh1.isIndirect()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xcd4,"void test_93(QPDF &, const char *)");
}

Assistant:

static void
test_93(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle equality. Two QPDFObjectHandle objects
    // are equal if they point to the same underlying object.

    auto trailer = pdf.getTrailer();
    auto root1 = trailer.getKey("/Root");
    auto root2 = pdf.getRoot();
    assert(root1.isSameObjectAs(root2));
    auto oh1 = "<< /One /Two >>"_qpdf;
    auto oh2 = oh1;
    assert(oh1.isSameObjectAs(oh2));
    auto oh3 = "<< /One /Two >>"_qpdf;
    assert(!oh1.isSameObjectAs(oh3));
    oh2.replaceKey("/One", "/Three"_qpdf);
    assert(oh1.isSameObjectAs(oh2));
    assert(oh2.unparse() == "<< /One /Three >>");
    assert(!oh1.isIndirect());
    auto oh4 = pdf.makeIndirectObject(oh1);
    assert(oh1.isSameObjectAs(oh4));
    assert(oh1.isIndirect());
    assert(oh4.isIndirect());
    trailer.replaceKey("/Potato", oh1);
    assert(trailer.getKey("/Potato").isSameObjectAs(oh2));
}